

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

string * __thiscall
gflags::anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *flagval,
          FlagSettingMode set_mode,bool errors_are_fatal)

{
  size_type sVar1;
  char *name;
  int iVar2;
  CommandLineFlag *flag;
  undefined8 *puVar3;
  char *__s;
  mapped_type *pmVar4;
  long *plVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  size_type *psVar6;
  ulong *puVar7;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  _Alloc_hider _Var11;
  undefined7 in_register_00000081;
  string envval;
  string envname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flaglist;
  string local_158;
  key_type local_138;
  allocator<char> local_111;
  key_type local_110;
  key_type local_f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_d0;
  CommandLineFlagParser *local_c8;
  FlagSettingMode local_c0;
  undefined4 local_bc;
  string *local_b8;
  ulong local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  long local_58;
  key_type local_50;
  
  local_bc = (undefined4)CONCAT71(in_register_00000081,errors_are_fatal);
  local_68 = &__return_storage_ptr__->field_2;
  sVar1 = flagval->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  local_c8 = this;
  local_c0 = set_mode;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX_00;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = __return_storage_ptr__;
  ParseFlagList((flagval->_M_dataplus)._M_p,&local_88);
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_d0 = &local_c8->error_flags_;
    local_60 = &local_c8->undefined_names_;
    lVar8 = 0;
    uVar10 = 0;
    do {
      name = *(char **)((long)&((local_88.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar8);
      local_b0 = uVar10;
      local_58 = lVar8;
      flag = FlagRegistry::FindFlagLocked(local_c8->registry_,name);
      if (flag == (CommandLineFlag *)0x0) {
        StringPrintf_abi_cxx11_
                  (&local_110,"%sunknown command line flag \'%s\' (via --fromenv or --tryfromenv)\n"
                   ,"ERROR: ",name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,name,(allocator<char> *)&local_158);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_d0,&local_138);
        std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,name,(allocator<char> *)&local_138);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,&local_110);
        std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x127378);
      }
      else {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"FLAGS_","");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,name,(allocator<char> *)&local_f0);
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          uVar10 = CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                            local_138.field_2._M_local_buf[0]);
        }
        if (uVar10 < local_158._M_string_length + local_138._M_string_length) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            uVar9 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_158._M_string_length + local_138._M_string_length)
          goto LAB_0011e9c9;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_158,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
        }
        else {
LAB_0011e9c9:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_138,(ulong)local_158._M_dataplus._M_p);
        }
        psVar6 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_110.field_2._M_allocated_capacity = *psVar6;
          local_110.field_2._8_8_ = puVar3[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar6;
          local_110._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_110._M_string_length = puVar3[1];
        *puVar3 = psVar6;
        puVar3[1] = 0;
        *(undefined1 *)psVar6 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        local_138._M_string_length = 0;
        local_138.field_2._M_local_buf[0] = '\0';
        __s = getenv(local_110._M_dataplus._M_p);
        if (__s == (char *)0x0) {
          if ((char)local_bc != '\0') {
            local_a8[0] = &local_98;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"ERROR: ","");
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_a8,(ulong)local_110._M_dataplus._M_p);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_f0.field_2._M_allocated_capacity = *psVar6;
              local_f0.field_2._8_8_ = plVar5[3];
            }
            else {
              local_f0.field_2._M_allocated_capacity = *psVar6;
              local_f0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_f0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            puVar7 = (ulong *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar7) {
              local_158.field_2._M_allocated_capacity = *puVar7;
              local_158.field_2._8_8_ = plVar5[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = *puVar7;
              local_158._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_158._M_string_length = plVar5[1];
            *plVar5 = (long)puVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_111);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](local_d0,&local_50);
            std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            uVar9 = local_98._M_allocated_capacity;
            _Var11._M_p = (pointer)local_a8[0];
            if (local_a8[0] != &local_98) goto LAB_0011ee12;
          }
        }
        else {
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)&local_138,0,(char *)0x0,(ulong)__s);
          iVar2 = std::__cxx11::string::compare((char *)&local_138);
          if ((iVar2 == 0) ||
             (iVar2 = std::__cxx11::string::compare((char *)&local_138), iVar2 == 0)) {
            StringPrintf_abi_cxx11_
                      (&local_158,"%sinfinite recursion on environment flag \'%s\'\n","ERROR: ",
                       local_138._M_dataplus._M_p);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,name,(allocator<char> *)local_a8);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](local_d0,&local_f0);
            std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_158);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                      (&local_158,local_c8,flag,local_138._M_dataplus._M_p,local_c0);
            std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_158._M_dataplus._M_p);
          }
          uVar9 = local_158.field_2._M_allocated_capacity;
          _Var11._M_p = local_158._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_0011ee12:
            operator_delete(_Var11._M_p,uVar9 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      uVar10 = local_b0 + 1;
      lVar8 = local_58 + 0x20;
    } while (uVar10 < (ulong)((long)local_88.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_88.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return extraout_RAX;
}

Assistant:

string CommandLineFlagParser::ProcessFromenvLocked(const string& flagval,
                                                   FlagSettingMode set_mode,
                                                   bool errors_are_fatal) {
  if (flagval.empty())
    return "";

  string msg;
  vector<string> flaglist;
  ParseFlagList(flagval.c_str(), &flaglist);

  for (size_t i = 0; i < flaglist.size(); ++i) {
    const char* flagname = flaglist[i].c_str();
    CommandLineFlag* flag = registry_->FindFlagLocked(flagname);
    if (flag == NULL) {
      error_flags_[flagname] =
          StringPrintf("%sunknown command line flag '%s' "
                       "(via --fromenv or --tryfromenv)\n",
                       kError, flagname);
      undefined_names_[flagname] = "";
      continue;
    }

    const string envname = string("FLAGS_") + string(flagname);
    string envval;
    if (!SafeGetEnv(envname.c_str(), envval)) {
      if (errors_are_fatal) {
        error_flags_[flagname] = (string(kError) + envname +
                                  " not found in environment\n");
      }
      continue;
    }

    // Avoid infinite recursion.
    if (envval == "fromenv" || envval == "tryfromenv") {
      error_flags_[flagname] =
          StringPrintf("%sinfinite recursion on environment flag '%s'\n",
                       kError, envval.c_str());
      continue;
    }

    msg += ProcessSingleOptionLocked(flag, envval.c_str(), set_mode);
  }
  return msg;
}